

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

VertexData<Vertex> * __thiscall
geometrycentral::surface::SurfaceMesh::separateNonmanifoldVertices
          (VertexData<Vertex> *__return_storage_ptr__,SurfaceMesh *this)

{
  bool bVar1;
  Vertex *pVVar2;
  unsigned_long uVar3;
  uint uVar4;
  runtime_error *this_00;
  char cVar5;
  ulong uVar6;
  pointer puVar7;
  unsigned_long uVar8;
  ulong uVar9;
  pointer puVar10;
  size_t sVar11;
  size_t i;
  size_t sVar12;
  pointer puVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  bool bVar17;
  Vertex VVar18;
  VertexData<Vertex> *parents;
  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  vertexEntries;
  VertexData<bool> baseVertexUsed;
  DisjointSets djSet;
  allocator_type local_d1;
  VertexData<Vertex> *local_d0;
  size_t local_c8;
  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  local_c0;
  size_t local_a8;
  MeshData<geometrycentral::surface::Vertex,_bool> local_a0;
  DisjointSets local_68;
  
  local_a8 = this->nHalfedgesFillCount;
  local_d0 = __return_storage_ptr__;
  DisjointSets::DisjointSets(&local_68,local_a8);
  sVar14 = this->nEdgesFillCount;
  if (sVar14 != 0) {
    puVar7 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar10 = (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar13 = puVar10;
    if (this->useImplicitTwinFlag != false) {
      puVar13 = puVar7;
    }
    if (*puVar13 == 0xffffffffffffffff) {
      sVar16 = 0;
      do {
        puVar10 = puVar10 + 1;
        puVar7 = puVar7 + 2;
        sVar15 = sVar14;
        if (sVar14 - 1 == sVar16) break;
        puVar13 = puVar10;
        if (this->useImplicitTwinFlag != false) {
          puVar13 = puVar7;
        }
        sVar16 = sVar16 + 1;
        sVar15 = sVar16;
      } while (*puVar13 == 0xffffffffffffffff);
      goto LAB_00163532;
    }
  }
  sVar15 = 0;
LAB_00163532:
  if (sVar15 != sVar14) {
    sVar16 = sVar14 - 1;
    local_c8 = sVar14;
    do {
      bVar1 = this->useImplicitTwinFlag;
      if (bVar1 == true) {
        bVar17 = this->nFacesFillCount <=
                 (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar15 * 2 + 1];
      }
      else {
        uVar3 = (this->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar15];
        bVar17 = (this->heSiblingArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3] == uVar3;
      }
      if (!bVar17) {
        if (bVar1 == false) {
          uVar3 = (this->heSiblingArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(this->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->eHalfedgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar15]]];
          uVar8 = (this->eHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar15];
        }
        else {
          uVar3 = sVar15 * 2;
          uVar8 = sVar15 * 2;
        }
        if (uVar3 != uVar8) {
          if (bVar1 == false) {
            uVar6 = (this->heSiblingArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(this->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar15]];
            uVar9 = (this->eHalfedgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar15];
          }
          else {
            uVar6 = sVar15 * 2 ^ 1;
            uVar9 = sVar15 * 2;
          }
          if (uVar6 != uVar9) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (this_00,"mesh must be edge-manifold for separateNonmanifoldVertices()");
            __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        }
        if (bVar1 == false) {
          sVar14 = (this->eHalfedgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar15];
          sVar12 = (this->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar14];
          cVar5 = (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar14];
          uVar4 = (uint)(this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar12];
        }
        else {
          sVar14 = sVar15 * 2;
          sVar12 = sVar14 ^ 1;
          cVar5 = '\x01';
          uVar4 = ~(uint)sVar12 & 1;
        }
        if ((uVar4 != 0) == (cVar5 != '\0')) {
          DisjointSets::merge(&local_68,sVar14,sVar12);
          puVar7 = (this->heNextArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          DisjointSets::merge(&local_68,puVar7[sVar14],puVar7[sVar12]);
          sVar14 = local_c8;
        }
        else {
          DisjointSets::merge(&local_68,
                              (this->heNextArr).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[sVar14],sVar12);
          DisjointSets::merge(&local_68,sVar14,
                              (this->heNextArr).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[sVar12]);
          sVar14 = local_c8;
        }
      }
      puVar7 = (this->eHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + sVar15 + 1;
      puVar10 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start + sVar15 * 2 + 2;
      do {
        sVar12 = sVar14;
        if (sVar16 == sVar15) break;
        puVar13 = puVar7;
        if ((this->useImplicitTwinFlag & 1U) != 0) {
          puVar13 = puVar10;
        }
        puVar7 = puVar7 + 1;
        puVar10 = puVar10 + 2;
        sVar15 = sVar15 + 1;
        sVar12 = sVar15;
      } while (*puVar13 == 0xffffffffffffffff);
      sVar15 = sVar12;
    } while (sVar12 != sVar14);
  }
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::MeshData
            (local_d0,this);
  local_a0.mesh = (ParentMeshT *)0x0;
  local_a0.defaultValue = true;
  local_a0._9_7_ = 0xffffffffffffff;
  ::std::vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  ::vector(&local_c0,local_a8,(value_type *)&local_a0,&local_d1);
  MeshData<geometrycentral::surface::Vertex,_bool>::MeshData(&local_a0,this,false);
  sVar14 = this->nHalfedgesFillCount;
  if ((sVar14 == 0) ||
     ((puVar7 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start, *puVar7 != 0xffffffffffffffff &&
      (*(this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < this->nFacesFillCount)))) {
    sVar16 = 0;
  }
  else {
    sVar15 = 1;
    sVar16 = sVar15;
    if (sVar14 != 1) {
      do {
        if ((puVar7[sVar15] != 0xffffffffffffffff) &&
           (sVar16 = sVar15,
           (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar15] < this->nFacesFillCount)) break;
        sVar15 = sVar15 + 1;
        sVar16 = sVar14;
      } while (sVar14 != sVar15);
    }
  }
  if (sVar16 != sVar14) {
    do {
      sVar15 = DisjointSets::find(&local_68,sVar16);
      if (local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar15].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
          == 0xffffffffffffffff) {
        sVar12 = (this->heVertexArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar16];
        if (local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[sVar12] == true) {
          VVar18 = getNewVertex(this);
          sVar11 = VVar18.
                   super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                   .ind;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar15].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = VVar18.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar15].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar11;
          pVVar2 = (local_d0->data).
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          pVVar2[sVar11].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = this;
          pVVar2[sVar11].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar12;
        }
        else {
          pVVar2 = (local_d0->data).
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          pVVar2[sVar12].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = this;
          pVVar2[sVar12].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar12;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar15].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = this;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar15].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar12;
          local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[sVar12] = true;
        }
      }
      uVar3 = local_c0.
              super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar15].
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .ind;
      (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar16] = uVar3;
      (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start[uVar3] = sVar16;
      sVar15 = sVar16 + 1;
      sVar16 = sVar15;
      if (sVar15 != sVar14) {
        do {
          if (((this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar15] != 0xffffffffffffffff) &&
             (sVar16 = sVar15,
             (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[sVar15] < this->nFacesFillCount)) break;
          sVar15 = sVar15 + 1;
          sVar16 = sVar14;
        } while (sVar14 != sVar15);
      }
    } while (sVar16 != sVar14);
  }
  initializeHalfedgeNeighbors(this);
  this->modificationTick = this->modificationTick + 1;
  MeshData<geometrycentral::surface::Vertex,_bool>::~MeshData(&local_a0);
  if (local_c0.
      super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.parent.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_d0;
}

Assistant:

VertexData<Vertex> SurfaceMesh::separateNonmanifoldVertices() {

  // Find edge-connected sets of corners
  size_t indMax = nHalfedgesFillCount;
  DisjointSets djSet(indMax);
  for (Edge e : edges()) {
    if (e.isBoundary()) continue;
    if (!e.isManifold()) {
      throw std::runtime_error("mesh must be edge-manifold for separateNonmanifoldVertices()");
    }
    Halfedge heA = e.halfedge();
    Halfedge heB = heA.sibling();

    if (heA.orientation() == heB.orientation()) {
      djSet.merge(heA.corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.next().corner().getIndex(), heB.next().corner().getIndex());
    } else {
      djSet.merge(heA.next().corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.corner().getIndex(), heB.next().corner().getIndex());
    }
  }

  // Make sure there is a distinct vertex entry for each component
  VertexData<Vertex> parents(*this);
  std::vector<Vertex> vertexEntries(indMax, Vertex());
  VertexData<bool> baseVertexUsed(*this, false);
  for (Corner c : corners()) {
    size_t iComp = djSet.find(c.getIndex());
    Vertex origV = c.vertex();

    // create vertex if needed
    if (vertexEntries[iComp] == Vertex()) {
      if (baseVertexUsed[origV]) {
        Vertex newV = getNewVertex();
        vertexEntries[iComp] = newV;
        parents[newV] = origV;
      } else {
        parents[origV] = origV;
        vertexEntries[iComp] = origV;
        baseVertexUsed[origV] = true;
      }
    }

    // hook up
    Vertex targetV = vertexEntries[iComp];
    Halfedge he = c.halfedge();
    heVertexArr[he.getIndex()] = targetV.getIndex();
    vHalfedgeArr[targetV.getIndex()] = he.getIndex();
  }

  // just rebuild these from scratch, rather than trying to maintain
  initializeHalfedgeNeighbors();

  modificationTick++;
  return parents;
}